

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Annotation::IsValid(ON_OBSOLETE_V5_Annotation *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  ON_2dPoint *this_00;
  int local_28;
  int i;
  int points_count;
  ON_TextLog *text_log_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  
  bVar1 = ON_Plane::IsValid(&this->m_plane);
  if (bVar1) {
    iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
    for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
      this_00 = ON_SimpleArray<ON_2dPoint>::operator[]
                          (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_28);
      bVar1 = ON_2dPoint::IsValid(this_00);
      if (!bVar1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n");
        }
        return false;
      }
    }
    if ((byte)(this->m_type - dtDimLinear) < 8) {
      this_local._7_1_ = true;
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",
                          (ulong)this->m_type);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_OBSOLETE_V5_Annotation - m_plane is not valid\n");
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::IsValid( ON_TextLog* text_log ) const
{
  if ( !m_plane.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_plane is not valid\n");
    }
    return false;
  }

  const int points_count = m_points.Count();

  int i;
  for ( i = 0; i < points_count; i++ )
  {
    if ( !m_points[i].IsValid() )
    {
      if ( text_log )
      {
        text_log->Print("ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n");
      }
      return false;
    }
  }

  switch ( m_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",m_type);
    }
    return false;
    break;
  }

  return true;
}